

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O3

void __thiscall wasm::Fuzzer::checkInhabitable(Fuzzer *this)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types;
  pointer pHVar1;
  pointer pHVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 local_298 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  long local_200;
  __node_base local_1f8 [47];
  Printed local_80;
  undefined1 local_58 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> verifiedInhabitable;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> inhabitable;
  
  types = &this->types;
  HeapTypeGenerator::makeInhabitable
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,types);
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nInhabitable types:\n\n",0x15);
    printTypes((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &verifiedInhabitable.
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  HeapTypeGenerator::getInhabitable
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &print.names._M_h._M_single_bucket,types);
  lVar8 = local_200 - (long)print.names._M_h._M_single_bucket;
  pHVar1 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pHVar2 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (print.names._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(print.names._M_h._M_single_bucket,
                    (long)local_1f8[0]._M_nxt - (long)print.names._M_h._M_single_bucket);
  }
  if (lVar8 == (long)pHVar1 - (long)pHVar2) {
    iVar3 = wasm::getTypeSystem();
    if (iVar3 == 0) {
      pHVar1 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar2 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar8 = (long)pHVar2 - (long)pHVar1;
      if (lVar8 != (long)inhabitable.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start -
                   (long)verifiedInhabitable.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage) {
        Fatal::Fatal((Fatal *)&print.names._M_h._M_single_bucket);
        Fatal::operator<<((Fatal *)&print.names._M_h._M_single_bucket,
                          (char (*) [68])
                          "Number of inhabitable types does not match number of original types");
LAB_00159bc5:
        Fatal::~Fatal((Fatal *)&print.names._M_h._M_single_bucket);
      }
      if (pHVar2 != pHVar1) {
        lVar8 = lVar8 >> 3;
        lVar7 = 0;
        do {
          if (pHVar1[lVar7].id !=
              verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[lVar7].id) {
            print.names._M_h._M_single_bucket = local_1f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&print.names._M_h._M_single_bucket,"");
            IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
            IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                      ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_298,types,
                       (DefaultTypeNameGenerator *)local_298,
                       (string *)&print.names._M_h._M_single_bucket);
            if (print.names._M_h._M_single_bucket != local_1f8) {
              operator_delete(print.names._M_h._M_single_bucket,
                              (ulong)((long)&(local_1f8[0]._M_nxt)->_M_nxt + 1));
            }
            Fatal::Fatal((Fatal *)&print.names._M_h._M_single_bucket);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1f8,"makeInhabitable incorrectly changed type ",0x29);
            TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
            operator()(&local_80,
                       (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                        *)local_298,
                       (HeapType)
                       (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                       _M_impl.super__Vector_impl_data._M_start[lVar7].id);
            Fatal::operator<<((Fatal *)&print.names._M_h._M_single_bucket,&local_80);
LAB_00159a1e:
            HeapType::Printed::~Printed(&local_80);
            goto LAB_00159bc5;
          }
          lVar7 = lVar7 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar7);
        goto LAB_001599b3;
      }
    }
  }
  else {
    HeapTypeGenerator::getInhabitable
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_58,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &verifiedInhabitable.
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((long)verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start - (long)local_58 !=
        (long)inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_start -
        (long)verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
      print.names._M_h._M_single_bucket = local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&print.names._M_h._M_single_bucket,"");
      IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
      IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_298,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &verifiedInhabitable.
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(DefaultTypeNameGenerator *)local_298,
                 (string *)&print.names._M_h._M_single_bucket);
      if (print.names._M_h._M_single_bucket != local_1f8) {
        operator_delete(print.names._M_h._M_single_bucket,
                        (ulong)((long)&(local_1f8[0]._M_nxt)->_M_nxt + 1));
      }
      if ((long)inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start -
          (long)verifiedInhabitable.
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != 0) {
        lVar8 = (long)inhabitable.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)verifiedInhabitable.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage >> 3;
        uVar5 = (long)verifiedInhabitable.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)local_58 >> 3;
        uVar6 = 0;
        do {
          uVar4 = uVar5 + 1;
          if ((uVar5 < uVar6) ||
             (uVar4 = uVar6,
             verifiedInhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar6].id !=
             ((pointer)((long)local_58 + uVar6 * 8))->id)) {
            Fatal::Fatal((Fatal *)&print.names._M_h._M_single_bucket);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1f8,"Found uninhabitable type: ",0x1a);
            TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
            operator()(&local_80,
                       (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                        *)local_298,
                       (HeapType)
                       verifiedInhabitable.
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[uVar4].id);
            Fatal::operator<<((Fatal *)&print.names._M_h._M_single_bucket,&local_80);
            goto LAB_00159a1e;
          }
          uVar6 = uVar6 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != uVar6);
      }
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&print.fallback);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&print.defaultGenerator.arrayCount);
    }
    if (local_58 != (undefined1  [8])0x0) {
      operator_delete((void *)local_58,
                      (long)verifiedInhabitable.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_58);
    }
  }
  if (verifiedInhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    return;
  }
LAB_001599b3:
  operator_delete(verifiedInhabitable.
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                  (long)inhabitable.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)verifiedInhabitable.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Fuzzer::checkInhabitable() {
  std::vector<HeapType> inhabitable = HeapTypeGenerator::makeInhabitable(types);
  if (verbose) {
    std::cout << "\nInhabitable types:\n\n";
    printTypes(inhabitable);
  }

  // Check whether any of the original types are uninhabitable.
  bool haveUninhabitable =
    HeapTypeGenerator::getInhabitable(types).size() != types.size();
  if (haveUninhabitable) {
    // Verify that the transformed types are inhabitable.
    auto verifiedInhabitable = HeapTypeGenerator::getInhabitable(inhabitable);
    if (verifiedInhabitable.size() != inhabitable.size()) {
      IndexedTypeNameGenerator print(inhabitable);
      for (size_t i = 0; i < inhabitable.size(); ++i) {
        if (i > verifiedInhabitable.size() ||
            inhabitable[i] != verifiedInhabitable[i]) {
          Fatal() << "Found uninhabitable type: " << print(inhabitable[i]);
        }
      }
    }
    // TODO: We could also check that the transformed types are the same as the
    // original types up to nullability.
  } else if (getTypeSystem() == TypeSystem::Isorecursive) {
    // Verify the produced inhabitable types are the same as the original types
    // (which also implies that they are indeed inhabitable).
    if (types.size() != inhabitable.size()) {
      Fatal() << "Number of inhabitable types does not match number of "
                 "original types";
    }
    for (size_t i = 0; i < types.size(); ++i) {
      if (types[i] != inhabitable[i]) {
        IndexedTypeNameGenerator print(types);
        Fatal() << "makeInhabitable incorrectly changed type "
                << print(types[i]);
      }
    }
  }
}